

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ptr<Statement> __thiscall Parser::ifStatement(Parser *this)

{
  undefined8 uVar1;
  bool bVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Parser *in_RSI;
  ptr<Statement> pVar3;
  undefined1 local_58 [16];
  ptr<StatementBlock> elseBlock;
  ptr<StatementBlock> ifBlock;
  ptr<Expression> condition;
  
  consume(in_RSI);
  expression((Parser *)&condition);
  statementBlock((Parser *)&ifBlock);
  elseBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  elseBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar2 = match(in_RSI,Else);
  if (bVar2) {
    consume(in_RSI);
    statementBlock((Parser *)local_58);
    std::__shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&elseBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2> *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  }
  std::
  make_shared<IfStatement,std::shared_ptr<Expression>&,std::shared_ptr<StatementBlock>&,std::shared_ptr<StatementBlock>&>
            ((shared_ptr<Expression> *)local_58,(shared_ptr<StatementBlock> *)&condition,&ifBlock);
  uVar1 = local_58._8_8_;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->filepath)._M_dataplus._M_p = (pointer)local_58._0_8_;
  (this->filepath)._M_string_length = uVar1;
  local_58._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&elseBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ifBlock.super___shared_ptr<StatementBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&condition.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Statement>)pVar3.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Statement> Parser::ifStatement() {
    consume();
    ptr<Expression> condition = expression();
    ptr<StatementBlock> ifBlock = statementBlock();
    ptr<StatementBlock> elseBlock;

    if(match(TokenType::Else)) {
        consume();
        elseBlock = statementBlock();
    }

    return make<IfStatement>(condition, ifBlock, elseBlock);
}